

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O2

ssize_t __thiscall
cplus::socket::Socket::recv(Socket *this,int __fd,void *__buf,size_t __n,int __flags)

{
  ByteArray *this_00;
  int __fd_00;
  char *__buf_00;
  size_t size;
  undefined4 in_register_00000034;
  
  this_00 = &this->buffer;
  lang::ByteArray::setSize(this_00,CONCAT44(in_register_00000034,__fd));
  lang::ByteArray::fillWithZero(this_00);
  __fd_00 = this->socket;
  __buf_00 = lang::ByteArray::getBuffer(this_00);
  size = ::recv(__fd_00,__buf_00,CONCAT44(in_register_00000034,__fd),(int)__buf);
  if (size != 0xffffffffffffffff) {
    lang::ByteArray::setSize(this_00,size);
  }
  return (ssize_t)this_00;
}

Assistant:

lang::ByteArray &Socket::recv(size_t bufferSize, int flags) {
			buffer.setSize(bufferSize);
			buffer.fillWithZero();
			auto readSize = ::recv(socket, buffer.getBuffer(), bufferSize, flags);
			if (readSize == -1)
				return buffer;
			buffer.setSize(static_cast<size_t>(readSize));
			return buffer;
		}